

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost89.c
# Opt level: O1

void gost_enc_cfb(gost_ctx *ctx,byte *iv,byte *clear,byte *cipher,int blocks)

{
  byte bVar1;
  byte bVar2;
  long lVar3;
  int iVar4;
  byte cur_iv [8];
  byte gamma [8];
  undefined8 local_40;
  byte local_38 [8];
  
  local_40 = *(undefined8 *)iv;
  if (0 < blocks) {
    iVar4 = 0;
    do {
      gostcrypt(ctx,(byte *)&local_40,local_38);
      lVar3 = 0;
      do {
        bVar1 = local_38[lVar3];
        bVar2 = clear[lVar3];
        cipher[lVar3] = bVar1 ^ bVar2;
        local_38[lVar3 + -8] = bVar1 ^ bVar2;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 8);
      iVar4 = iVar4 + 1;
      clear = clear + 8;
      cipher = cipher + 8;
    } while (iVar4 != blocks);
  }
  return;
}

Assistant:

void gost_enc_cfb(gost_ctx * ctx, const byte * iv, const byte * clear,
                  byte * cipher, int blocks)
{
    byte cur_iv[8];
    byte gamma[8];
    int i, j;
    const byte *in;
    byte *out;
    memcpy(cur_iv, iv, 8);
    for (i = 0, in = clear, out = cipher; i < blocks; i++, in += 8, out += 8) {
        gostcrypt(ctx, cur_iv, gamma);
        for (j = 0; j < 8; j++) {
            cur_iv[j] = out[j] = in[j] ^ gamma[j];
        }
    }
}